

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QList<QLocale::Country> *
QLocale::countriesForLanguage(QList<QLocale::Country> *__return_storage_ptr__,Language language)

{
  QLocale *pQVar1;
  QList<QLocale> *__range1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QLocale> local_58;
  Country local_32;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QLocale *)&DAT_aaaaaaaaaaaaaaaa;
  matchingLocales((QList<QLocale> *)&local_58,language,AnyScript,AnyCountry);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (Country *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QLocale::Country>::reserve(__return_storage_ptr__,local_58.size);
  pQVar1 = local_58.ptr;
  if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
    lVar3 = local_58.size << 3;
    lVar2 = 0;
    do {
      local_32 = *(Country *)(**(long **)((long)&(pQVar1->d).d.ptr + lVar2) + 4);
      QtPrivate::QPodArrayOps<QLocale::Country>::emplace<QLocale::Country&>
                ((QPodArrayOps<QLocale::Country> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_32);
      QList<QLocale::Country>::end(__return_storage_ptr__);
      lVar2 = lVar2 + 8;
    } while (lVar3 != lVar2);
  }
  QArrayDataPointer<QLocale>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QLocale::Country> QLocale::countriesForLanguage(Language language)
{
    const auto locales = matchingLocales(language, AnyScript, AnyCountry);
    QList<Country> result;
    result.reserve(locales.size());
    for (const auto &locale : locales)
        result.append(locale.territory());
    return result;
}